

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_port6(compiler_state_t *cstate,int port,int ip_proto,int dir)

{
  block *b0;
  block *b1;
  block *pbVar1;
  
  b0 = gen_linktype(cstate,0x86dd);
  if (ip_proto == -1) {
    pbVar1 = gen_portop6(cstate,port,6,dir);
    b1 = gen_portop6(cstate,port,0x11,dir);
    gen_or(pbVar1,b1);
    pbVar1 = gen_portop6(cstate,port,0x84,dir);
    gen_or(pbVar1,b1);
  }
  else {
    if (((ip_proto != 6) && (ip_proto != 0x84)) && (ip_proto != 0x11)) {
      abort();
    }
    b1 = gen_portop6(cstate,port,ip_proto,dir);
  }
  gen_and(b0,b1);
  return b1;
}

Assistant:

static struct block *
gen_port6(compiler_state_t *cstate, int port, int ip_proto, int dir)
{
	struct block *b0, *b1, *tmp;

	/* link proto ip6 */
	b0 = gen_linktype(cstate, ETHERTYPE_IPV6);

	switch (ip_proto) {
	case IPPROTO_UDP:
	case IPPROTO_TCP:
	case IPPROTO_SCTP:
		b1 = gen_portop6(cstate, port, ip_proto, dir);
		break;

	case PROTO_UNDEF:
		tmp = gen_portop6(cstate, port, IPPROTO_TCP, dir);
		b1 = gen_portop6(cstate, port, IPPROTO_UDP, dir);
		gen_or(tmp, b1);
		tmp = gen_portop6(cstate, port, IPPROTO_SCTP, dir);
		gen_or(tmp, b1);
		break;

	default:
		abort();
	}
	gen_and(b0, b1);
	return b1;
}